

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
::uninitialized_move_n
          (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
           *this,size_type n,size_type i,size_type j,
          btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
          *x,allocator_type *alloc)

{
  uint64 *puVar1;
  VType VVar2;
  slot_type *psVar3;
  slot_type *psVar4;
  long lVar5;
  
  slot(x,(int)j);
  psVar3 = slot(this,(int)i);
  psVar4 = slot(x,(int)j);
  for (lVar5 = 0; n * 0x28 - lVar5 != 0; lVar5 = lVar5 + 0x28) {
    puVar1 = (uint64 *)((long)psVar4 + lVar5);
    *puVar1 = (psVar3->value).first.id_;
    *(int *)(puVar1 + 1) =
         (psVar3->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
         super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
    VVar2 = (psVar3->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
            super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[1];
    puVar1[2] = (uint64)(psVar3->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
                        super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[0];
    puVar1[3] = (uint64)VVar2;
    puVar1[4] = (uint64)(psVar3->value).second.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
                        super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[2];
    psVar3 = psVar3 + 1;
  }
  return;
}

Assistant:

void uninitialized_move_n(const size_type n, const size_type i,
                            const size_type j, btree_node *x,
                            allocator_type *alloc) {
    absl::container_internal::SanitizerUnpoisonMemoryRegion(
        x->slot(j), n * sizeof(slot_type));
    for (slot_type *src = slot(i), *end = src + n, *dest = x->slot(j);
         src != end; ++src, ++dest) {
      slot_type::construct(alloc, dest, src);
    }
  }